

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O1

BoundCastInfo *
duckdb::MapCastFunction
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  bind_cast_function_t p_Var1;
  optional_ptr<duckdb::MapCastNode,_true> entry;
  _Head_base<0UL,_duckdb::BoundCastData_*,_false> local_40;
  optional_ptr<duckdb::MapCastNode,_true> local_38;
  
  optional_ptr<duckdb::BindCastInfo,_true>::CheckValid(&input->info);
  local_38 = MapCastInfo::GetEntry((MapCastInfo *)(input->info).ptr,source,target);
  if (local_38.ptr == (MapCastNode *)0x0) {
    local_40._M_head_impl = (BoundCastData *)0x0;
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,(cast_function_t)0x0,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)&local_40,(init_cast_local_state_t)0x0);
    if (local_40._M_head_impl != (BoundCastData *)0x0) {
      (*(local_40._M_head_impl)->_vptr_BoundCastData[1])();
    }
  }
  else {
    optional_ptr<duckdb::MapCastNode,_true>::CheckValid(&local_38);
    p_Var1 = (local_38.ptr)->bind_function;
    optional_ptr<duckdb::MapCastNode,_true>::CheckValid(&local_38);
    if (p_Var1 == (bind_cast_function_t)0x0) {
      BoundCastInfo::Copy(__return_storage_ptr__,&(local_38.ptr)->cast_info);
    }
    else {
      (*(local_38.ptr)->bind_function)(__return_storage_ptr__,input,source,target);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo MapCastFunction(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	D_ASSERT(input.info);
	auto &map_info = input.info->Cast<MapCastInfo>();
	auto entry = map_info.GetEntry(source, target);
	if (entry) {
		if (entry->bind_function) {
			return entry->bind_function(input, source, target);
		}
		return entry->cast_info.Copy();
	}
	return nullptr;
}